

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optCompare_valueOptNotEmptyEqual_Test::optCompare_valueOptNotEmptyEqual_Test
          (optCompare_valueOptNotEmptyEqual_Test *this)

{
  optCompare_valueOptNotEmptyEqual_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__optCompare_valueOptNotEmptyEqual_Test_0025c318
  ;
  return;
}

Assistant:

TEST(optCompare, valueOptNotEmptyEqual)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i{1};
  EXPECT_TRUE(1 == i);
  EXPECT_FALSE(1 != i);
  EXPECT_FALSE(1 < i);
  EXPECT_FALSE(1 > i);
  EXPECT_TRUE(1 <= i);
  EXPECT_TRUE(1 >= i);
}